

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

void __thiscall udpdiscovery::impl::PeerEnv::ReceivingThreadFunc(PeerEnv *this)

{
  MinimalisticMutex *__mutex;
  bool bVar1;
  ssize_t sVar2;
  long cur_time_ms;
  AddressLenType addr_length;
  string buffer;
  sockaddr_in from_addr;
  socklen_t local_6c;
  IpPort local_68;
  string local_60;
  sockaddr local_40;
  
  __mutex = &this->lock_;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this->ref_count_ = this->ref_count_ + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  do {
    local_6c = 0x10;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&local_60);
    sVar2 = recvfrom(this->binding_sock_,local_60._M_dataplus._M_p,local_60._M_string_length,0,
                     &local_40,&local_6c);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    bVar1 = this->exit_;
    if (bVar1 == true) {
      decreaseRefCountAndMaybeDestroySelfAndUnlock(this);
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (0 < (int)sVar2) {
        local_68.port_ =
             (int)(ushort)(local_40.sa_data._0_2_ << 8 | (ushort)local_40.sa_data._0_2_ >> 8);
        local_68.ip_ = (uint)local_40.sa_data._2_4_ >> 0x18 |
                       (local_40.sa_data._2_4_ & 0xff0000) >> 8 |
                       (local_40.sa_data._2_4_ & 0xff00) << 8 | local_40.sa_data._2_4_ << 0x18;
        std::__cxx11::string::resize((ulong)&local_60);
        cur_time_ms = NowTime();
        processReceivedBuffer(this,cur_time_ms,&local_68,&local_60);
      }
    }
    std::__cxx11::string::_M_dispose();
  } while (bVar1 == false);
  return;
}

Assistant:

void ReceivingThreadFunc() {
    lock_.Lock();
    ++ref_count_;
    lock_.Unlock();

    while (true) {
      sockaddr_in from_addr;
      AddressLenType addr_length = sizeof(sockaddr_in);

      std::string buffer;
      buffer.resize(kMaxPacketSize);

      int length = (int)recvfrom(binding_sock_, &buffer[0], buffer.size(), 0,
                                 (struct sockaddr*)&from_addr, &addr_length);

      lock_.Lock();
      if (exit_) {
        decreaseRefCountAndMaybeDestroySelfAndUnlock();
        return;
      }
      lock_.Unlock();

      if (length <= 0) {
        continue;
      }

      IpPort from;
      from.set_port(ntohs(from_addr.sin_port));
      from.set_ip(ntohl(from_addr.sin_addr.s_addr));

      buffer.resize(length);
      processReceivedBuffer(NowTime(), from, buffer);
    }
  }